

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageIO.cpp
# Opt level: O2

Image * nv::ImageIO::loadPSD(Stream *s)

{
  uint16 uVar1;
  bool bVar2;
  int iVar3;
  Image *this;
  Color32 *pCVar4;
  AutoPtr<nv::Image> AVar5;
  char *__s;
  uint uVar6;
  uint8 *puVar7;
  uint uVar8;
  long lVar10;
  uint channel;
  uint uVar11;
  ulong uVar12;
  uint8 val;
  uint8 c;
  AutoPtr<nv::Image> img;
  uint16 compression;
  ulong local_68;
  PsdHeader header;
  anon_union_4_2_12391d8d_for_Color32_0 local_38;
  int tmp;
  uint uVar9;
  
  iVar3 = (*s->_vptr_Stream[6])();
  if (((char)iVar3 != '\0') &&
     (iVar3 = nvAbort("!s.isError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/ImageIO.cpp"
                      ,0x1c3,"Image *nv::ImageIO::loadPSD(Stream &)"), iVar3 == 1)) {
    raise(5);
  }
  iVar3 = (*s->_vptr_Stream[10])(s);
  if (((char)iVar3 == '\0') &&
     (iVar3 = nvAbort("s.isLoading()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/ImageIO.cpp"
                      ,0x1c4,"Image *nv::ImageIO::loadPSD(Stream &)"), iVar3 == 1)) {
    raise(5);
  }
  s->m_byteOrder = BigEndian;
  operator<<(s,&header);
  if (header.signature == 0x38425053) {
    bVar2 = PsdHeader::isSupported(&header);
    if (bVar2) {
      operator<<(s,&tmp);
      iVar3 = (*s->_vptr_Stream[4])(s);
      (*s->_vptr_Stream[3])(s,(ulong)(uint)(iVar3 + tmp));
      operator<<(s,&tmp);
      iVar3 = (*s->_vptr_Stream[4])(s);
      (*s->_vptr_Stream[3])(s,(ulong)(uint)(iVar3 + tmp));
      operator<<(s,&tmp);
      iVar3 = (*s->_vptr_Stream[4])(s);
      (*s->_vptr_Stream[3])(s,(ulong)(uint)(iVar3 + tmp));
      operator<<(s,&compression);
      uVar1 = header.channel_count;
      if (1 < compression) {
        return (Image *)0x0;
      }
      uVar12 = (ulong)header.channel_count;
      this = (Image *)operator_new(0x18);
      Image::Image(this);
      img.m_ptr = this;
      Image::allocate(this,header.width,header.height);
      if (uVar1 < 4) {
        local_38.u = 0xff000000;
        Image::fill(img.m_ptr,(Color32 *)&local_38.field_0);
      }
      else {
        Image::setFormat(img.m_ptr,Format_ARGB);
        uVar12 = 4;
      }
      uVar6 = header.width * header.height;
      local_68 = uVar12;
      if (compression == 0) {
        for (uVar12 = 0; uVar12 != local_68; uVar12 = uVar12 + 1) {
          pCVar4 = Image::pixels(img.m_ptr);
          lVar10 = (long)&pCVar4->field_0 + (ulong)loadPSD::components[uVar12];
          uVar11 = uVar6;
          while (bVar2 = uVar11 != 0, uVar11 = uVar11 - 1, bVar2) {
            (*s->_vptr_Stream[2])(s,lVar10,1);
            lVar10 = lVar10 + 4;
          }
        }
      }
      else {
        iVar3 = (*s->_vptr_Stream[4])(s);
        (*s->_vptr_Stream[3])(s,(ulong)(iVar3 + header.channel_count * header.height * 2));
        for (uVar12 = 0; uVar12 != local_68; uVar12 = uVar12 + 1) {
          pCVar4 = Image::pixels(img.m_ptr);
          puVar7 = (uint8 *)((long)&pCVar4->field_0 + (ulong)loadPSD::components[uVar12]);
          uVar11 = 0;
LAB_001a7303:
          while (uVar11 < uVar6) {
            iVar3 = (*s->_vptr_Stream[8])(s);
            if ((char)iVar3 != '\0') goto LAB_001a73cf;
            (*s->_vptr_Stream[2])(s,&c,1);
            uVar8 = (uint)c;
            uVar9 = (uint)c;
            if ((char)c < '\0') goto LAB_001a7364;
            uVar11 = uVar11 + uVar8 + 1;
            if (uVar6 < uVar11) goto LAB_001a73cf;
            iVar3 = uVar9 + 1;
            while (bVar2 = iVar3 != 0, iVar3 = iVar3 + -1, bVar2) {
              (*s->_vptr_Stream[2])(s,puVar7,1);
              puVar7 = puVar7 + 4;
            }
          }
        }
      }
      AVar5.m_ptr = img.m_ptr;
      img.m_ptr = (Image *)0x0;
LAB_001a742b:
      AutoPtr<nv::Image>::~AutoPtr(&img);
      return AVar5.m_ptr;
    }
    __s = "unsupported file!";
  }
  else {
    __s = "invalid header!";
  }
  puts(__s);
  return (Image *)0x0;
LAB_001a7364:
  if (uVar9 != 0x80) {
    iVar3 = (*s->_vptr_Stream[8])(s);
    uVar11 = (uVar11 - uVar9) + 0x101;
    if ((char)iVar3 != '\0' || uVar6 < uVar11) {
LAB_001a73cf:
      AVar5.m_ptr = (Image *)0x0;
      goto LAB_001a742b;
    }
    (*s->_vptr_Stream[2])(s,&val,1);
    for (iVar3 = uVar8 - 0x101; iVar3 != 0; iVar3 = iVar3 + 1) {
      *puVar7 = val;
      puVar7 = puVar7 + 4;
    }
  }
  goto LAB_001a7303;
}

Assistant:

Image * nv::ImageIO::loadPSD(Stream & s)
{
	nvCheck(!s.isError());
	nvCheck(s.isLoading());
	
	s.setByteOrder(Stream::BigEndian);
	
	PsdHeader header;
	s << header;
	
	if (!header.isValid())
	{
		printf("invalid header!\n");
		return NULL;
	}
	
	if (!header.isSupported())
	{
		printf("unsupported file!\n");
		return NULL;
	}
	
	int tmp;
	
	// Skip mode data.
	s << tmp;
	s.seek(s.tell() + tmp);

	// Skip image resources.
	s << tmp;
	s.seek(s.tell() + tmp);
	
	// Skip the reserved data.
	s << tmp;
	s.seek(s.tell() + tmp);
	
	// Find out if the data is compressed.
	// Known values:
	//   0: no compression
	//   1: RLE compressed
	uint16 compression;
	s << compression;
	
	if (compression > 1) {
		// Unknown compression type.
		return NULL;
	}
	
	uint channel_num = header.channel_count;
	
	AutoPtr<Image> img(new Image());
	img->allocate(header.width, header.height);
	
	if (channel_num < 4)
	{
		// Clear the image.
		img->fill(Color32(0, 0, 0, 0xFF));
	}
	else
	{
		// Enable alpha.
		img->setFormat(Image::Format_ARGB);
		
		// Ignore remaining channels.
		channel_num = 4;
	}
	
	
	const uint pixel_count = header.height * header.width;
	
	static const uint components[4] = {2, 1, 0, 3};
	
	if (compression)
	{
		s.seek(s.tell() + header.height * header.channel_count * sizeof(uint16));
		
		// Read RLE data.						
		for (uint channel = 0; channel < channel_num; channel++)
		{
			uint8 * ptr = (uint8 *)img->pixels() + components[channel];
			
			uint count = 0;
			while( count < pixel_count )
			{
				if (s.isAtEnd()) return NULL;
				
				uint8 c;
				s << c;
				
				uint len = c;
				if (len < 128)
				{
					// Copy next len+1 bytes literally.
					len++;
					count += len;
					if (count > pixel_count) return NULL;
	
					while (len != 0)
					{
						s << *ptr;
						ptr += 4;
						len--;
					}
				} 
				else if (len > 128)
				{
					// Next -len+1 bytes in the dest are replicated from next source byte.
					// (Interpret len as a negative 8-bit int.)
					len ^= 0xFF;
					len += 2;
					count += len;
					if (s.isAtEnd() || count > pixel_count) return NULL;
					
					uint8 val;
					s << val;
					while( len != 0 ) {
						*ptr = val;
						ptr += 4;
						len--;
					}
				}
				else if( len == 128 ) {
					// No-op.
				}
			}
		}
	}
	else
	{
		// We're at the raw image data. It's each channel in order (Red, Green, Blue, Alpha, ...)
		// where each channel consists of an 8-bit value for each pixel in the image.
		
		// Read the data by channel.
		for (uint channel = 0; channel < channel_num; channel++)
		{
			uint8 * ptr = (uint8 *)img->pixels() + components[channel];
			
			// Read the data.
			uint count = pixel_count;
			while (count != 0)
			{
				s << *ptr;
				ptr += 4;
				count--;
			}
		}
	}

	return img.release();
}